

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR parse_feature(lysp_yang_ctx *ctx,lysp_feature **features)

{
  LY_ERR LVar1;
  lysp_feature *str_p;
  char *pcVar2;
  ly_ctx *local_c8;
  ly_ctx *local_b0;
  char *local_a8;
  ly_ctx *local_98;
  ly_ctx *local_90;
  ly_ctx *local_88;
  ly_ctx *local_80;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  ly_bool __loop_end;
  undefined8 *puStack_58;
  LY_ERR ret__;
  char *p__;
  lysp_feature *feat;
  size_t sStack_40;
  ly_stmt kw;
  size_t word_len;
  char *word;
  char *buf;
  lysp_feature **pplStack_20;
  LY_ERR ret;
  lysp_feature **features_local;
  lysp_yang_ctx *ctx_local;
  
  buf._4_4_ = 0;
  pplStack_20 = features;
  features_local = (lysp_feature **)ctx;
  if (*features == (lysp_feature *)0x0) {
    puStack_58 = (undefined8 *)malloc(0x48);
    if (puStack_58 == (undefined8 *)0x0) {
      if (features_local == (lysp_feature **)0x0) {
        local_88 = (ly_ctx *)0x0;
      }
      else {
        local_88 = (ly_ctx *)
                   **(undefined8 **)
                     (&features_local[7]->iffeatures->str)
                     [*(int *)((long)&features_local[7]->name + 4) - 1];
      }
      ly_log(local_88,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_feature");
      return LY_EMEM;
    }
    *puStack_58 = 1;
  }
  else {
    *(long *)&(*features)[-1].flags = *(long *)&(*features)[-1].flags + 1;
    puStack_58 = (undefined8 *)
                 realloc(&(*features)[-1].flags,*(long *)&(*features)[-1].flags * 0x40 + 8);
    if (puStack_58 == (undefined8 *)0x0) {
      *(long *)&(*pplStack_20)[-1].flags = *(long *)&(*pplStack_20)[-1].flags + -1;
      if (features_local == (lysp_feature **)0x0) {
        local_80 = (ly_ctx *)0x0;
      }
      else {
        local_80 = (ly_ctx *)
                   **(undefined8 **)
                     (&features_local[7]->iffeatures->str)
                     [*(int *)((long)&features_local[7]->name + 4) - 1];
      }
      ly_log(local_80,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_feature");
      return LY_EMEM;
    }
  }
  *pplStack_20 = (lysp_feature *)(puStack_58 + 1);
  str_p = *pplStack_20 + *(long *)&(*pplStack_20)[-1].flags + -1;
  memset(str_p,0,0x40);
  LVar1 = get_argument((lysp_yang_ctx *)features_local,Y_IDENTIF_ARG,(uint16_t *)0x0,
                       (char **)&word_len,&word,&stack0xffffffffffffffc0);
  if (LVar1 != LY_SUCCESS) {
    return LVar1;
  }
  if (word == (char *)0x0) {
    if (features_local == (lysp_feature **)0x0) {
      local_98 = (ly_ctx *)0x0;
    }
    else {
      local_98 = (ly_ctx *)
                 **(undefined8 **)
                   (&features_local[7]->iffeatures->str)
                   [*(int *)((long)&features_local[7]->name + 4) - 1];
    }
    if (sStack_40 == 0) {
      local_a8 = "";
    }
    else {
      local_a8 = (char *)word_len;
    }
    buf._4_4_ = lydict_insert(local_98,local_a8,sStack_40,&str_p->name);
  }
  else {
    if (features_local == (lysp_feature **)0x0) {
      local_90 = (ly_ctx *)0x0;
    }
    else {
      local_90 = (ly_ctx *)
                 **(undefined8 **)
                   (&features_local[7]->iffeatures->str)
                   [*(int *)((long)&features_local[7]->name + 4) - 1];
    }
    buf._4_4_ = lydict_insert_zc(local_90,(char *)word_len,&str_p->name);
  }
  if (buf._4_4_ == LY_SUCCESS) {
    buf._4_4_ = 0;
    buf._4_4_ = get_keyword((lysp_yang_ctx *)features_local,(ly_stmt *)((long)&feat + 4),
                            (char **)&word_len,&stack0xffffffffffffffc0);
    if (buf._4_4_ == LY_SUCCESS) {
      if (feat._4_4_ == LY_STMT_SYNTAX_SEMICOLON) {
        ret___2._3_1_ = 1;
        LVar1 = buf._4_4_;
      }
      else {
        if (feat._4_4_ != LY_STMT_SYNTAX_LEFT_BRACE) {
          if (features_local == (lysp_feature **)0x0) {
            local_b0 = (ly_ctx *)0x0;
          }
          else {
            local_b0 = (ly_ctx *)
                       **(undefined8 **)
                         (&features_local[7]->iffeatures->str)
                         [*(int *)((long)&features_local[7]->name + 4) - 1];
          }
          pcVar2 = lyplg_ext_stmt2str(feat._4_4_);
          ly_vlog(local_b0,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar2);
          return LY_EVALID;
        }
        LVar1 = get_keyword((lysp_yang_ctx *)features_local,(ly_stmt *)((long)&feat + 4),
                            (char **)&word_len,&stack0xffffffffffffffc0);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        ret___2._3_1_ = feat._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE;
        LVar1 = LY_SUCCESS;
      }
      while (buf._4_4_ = LVar1, !(bool)ret___2._3_1_) {
        if (feat._4_4_ == LY_STMT_DESCRIPTION) {
          LVar1 = parse_text_field((lysp_yang_ctx *)features_local,str_p->dsc,LY_STMT_DESCRIPTION,0,
                                   &str_p->dsc,Y_STR_ARG,(uint16_t *)0x0,&str_p->exts);
        }
        else if (feat._4_4_ == LY_STMT_EXTENSION_INSTANCE) {
          LVar1 = parse_ext((lysp_yang_ctx *)features_local,(char *)word_len,sStack_40,str_p,
                            LY_STMT_FEATURE,0,&str_p->exts);
        }
        else if (feat._4_4_ == LY_STMT_IF_FEATURE) {
          LVar1 = parse_qnames((lysp_yang_ctx *)features_local,LY_STMT_IF_FEATURE,&str_p->iffeatures
                               ,Y_STR_ARG,&str_p->exts);
        }
        else if (feat._4_4_ == LY_STMT_REFERENCE) {
          LVar1 = parse_text_field((lysp_yang_ctx *)features_local,str_p->ref,LY_STMT_REFERENCE,0,
                                   &str_p->ref,Y_STR_ARG,(uint16_t *)0x0,&str_p->exts);
        }
        else {
          if (feat._4_4_ != LY_STMT_STATUS) {
            if (features_local == (lysp_feature **)0x0) {
              local_c8 = (ly_ctx *)0x0;
            }
            else {
              local_c8 = (ly_ctx *)
                         **(undefined8 **)
                           (&features_local[7]->iffeatures->str)
                           [*(int *)((long)&features_local[7]->name + 4) - 1];
            }
            pcVar2 = lyplg_ext_stmt2str(feat._4_4_);
            ly_vlog(local_c8,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\".",pcVar2,"feature");
            return LY_EVALID;
          }
          LVar1 = parse_status((lysp_yang_ctx *)features_local,&str_p->flags,&str_p->exts);
        }
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        buf._4_4_ = get_keyword((lysp_yang_ctx *)features_local,(ly_stmt *)((long)&feat + 4),
                                (char **)&word_len,&stack0xffffffffffffffc0);
        if (buf._4_4_ != LY_SUCCESS) {
          return buf._4_4_;
        }
        LVar1 = LY_SUCCESS;
        if (feat._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE) {
          if ((str_p->exts != (lysp_ext_instance *)0x0) &&
             (LVar1 = ly_set_add((ly_set *)&features_local[8]->ref,str_p->exts,'\x01',
                                 (uint32_t *)0x0), LVar1 != LY_SUCCESS)) {
            return LVar1;
          }
          buf._4_4_ = LVar1;
          ret___2._3_1_ = true;
          LVar1 = buf._4_4_;
        }
      }
    }
  }
  return buf._4_4_;
}

Assistant:

LY_ERR
parse_feature(struct lysp_yang_ctx *ctx, struct lysp_feature **features)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_feature *feat;

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *features, feat, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, feat->name, word, word_len, ret, cleanup);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, feat->dsc, LY_STMT_DESCRIPTION, 0, &feat->dsc, Y_STR_ARG, NULL, &feat->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &feat->iffeatures, Y_STR_ARG, &feat->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, feat->ref, LY_STMT_REFERENCE, 0, &feat->ref, Y_STR_ARG, NULL, &feat->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &feat->flags, &feat->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, feat, LY_STMT_FEATURE, 0, &feat->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "feature");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, feat->exts, ret, cleanup);
    }

cleanup:
    return ret;
}